

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

int lj_str_haspattern(GCstr *s)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  GCstr *pGVar4;
  
  pGVar4 = s + 1;
  uVar2 = s->len;
  do {
    if ((GCstr *)((long)&s[1].nextgc.gcptr32 + (ulong)uVar2) <= pGVar4) {
      return 0;
    }
    bVar1 = (byte)(pGVar4->nextgc).gcptr32;
    pGVar4 = (GCstr *)((long)&(pGVar4->nextgc).gcptr32 + 1);
  } while (((""[(ulong)bVar1 + 1] & 4) == 0) ||
          (pvVar3 = memchr("^$*+?.([%-",(uint)bVar1,0xb), pvVar3 == (void *)0x0));
  return 1;
}

Assistant:

int lj_str_haspattern(GCstr *s)
{
  const char *p = strdata(s), *q = p + s->len;
  while (p < q) {
    int c = *(const uint8_t *)p++;
    if (lj_char_ispunct(c) && strchr("^$*+?.([%-", c))
      return 1;  /* Found a pattern matching char. */
  }
  return 0;  /* No pattern matching chars found. */
}